

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

TypeId __thiscall
Js::JavascriptNativeFloatArray::TrySetNativeFloatArrayItem
          (JavascriptNativeFloatArray *this,Var value,double *dValue)

{
  bool bVar1;
  int32 iVar2;
  double dVar3;
  double *dValue_local;
  Var value_local;
  JavascriptNativeFloatArray *this_local;
  
  bVar1 = TaggedInt::Is(value);
  if (bVar1) {
    iVar2 = TaggedInt::ToInt32(value);
    *dValue = (double)iVar2;
    this_local._4_4_ = TypeIds_ArrayLast;
  }
  else {
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(value);
    if (bVar1) {
      dVar3 = JavascriptNumber::GetValue(value);
      *dValue = dVar3;
      this_local._4_4_ = TypeIds_ArrayLast;
    }
    else {
      ToVarArray(this);
      this_local._4_4_ = TypeIds_Array;
    }
  }
  return this_local._4_4_;
}

Assistant:

TypeId JavascriptNativeFloatArray::TrySetNativeFloatArrayItem(Var value, double *dValue)
    {
        if (TaggedInt::Is(value))
        {
            *dValue = (double)TaggedInt::ToInt32(value);
            return TypeIds_NativeFloatArray;
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(value))
        {
            *dValue = JavascriptNumber::GetValue(value);
            return TypeIds_NativeFloatArray;
        }

        JavascriptNativeFloatArray::ToVarArray(this);
        return TypeIds_Array;
    }